

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linkage.c
# Opt level: O3

void resolve_object_linkage
               (Scope *scope,Translation_Data *translation_data,Denoted_Object *denoted_object)

{
  Scope_Type SVar1;
  Storage_Class_Specifier SVar2;
  Object *pOVar3;
  Linkage_Type LVar4;
  void *pvVar5;
  
  SVar1 = scope->type;
  if (SVar1 == FUNCTION_PROTOTYPE_SCOPE) {
    denoted_object->linkage = LINKAGE_NONE;
    denoted_object->object->storage_class = SCS_NONE;
  }
  else {
    if (SVar1 == BLOCK_SCOPE) {
      denoted_object->linkage = LINKAGE_NONE;
      if (denoted_object->object->storage_class != SCS_EXTERN) goto LAB_0014953c;
    }
    else {
      if (SVar1 != FILE_SCOPE) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/GTSimeonov[P]IOPL_Project/src/semantics/identifiers/linkage.c"
                      ,0x68,
                      "void resolve_object_linkage(struct Scope *, struct Translation_Data *, struct Denoted_Object *)"
                     );
      }
      pOVar3 = denoted_object->object;
      SVar2 = pOVar3->storage_class;
      if (SVar2 != SCS_NONE) {
        if (SVar2 == SCS_STATIC) {
          denoted_object->linkage = LINKAGE_INTERNAL;
          pOVar3->storage_class = SCS_STATIC;
          goto LAB_0014953c;
        }
        if (SVar2 != SCS_EXTERN) {
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/GTSimeonov[P]IOPL_Project/src/semantics/identifiers/linkage.c"
                        ,0x55,
                        "void resolve_object_linkage(struct Scope *, struct Translation_Data *, struct Denoted_Object *)"
                       );
        }
      }
      denoted_object->linkage = LINKAGE_EXTERNAL;
      pOVar3->storage_class = SCS_STATIC;
    }
    account_for_upper_linkage_on_object(scope,translation_data,denoted_object);
  }
LAB_0014953c:
  LVar4 = denoted_object->linkage;
  if (LVar4 == LINKAGE_EXTERNAL) {
    pvVar5 = Map_Check(&translation_data->internal_linkage->ids,denoted_object->id->data,
                       denoted_object->id->data_size);
    if (pvVar5 != (void *)0x0) goto LAB_00149585;
    LVar4 = denoted_object->linkage;
  }
  if (LVar4 == LINKAGE_INTERNAL) {
    pvVar5 = Map_Check(&translation_data->external_linkage->ids,denoted_object->id->data,
                       denoted_object->id->data_size);
    if (pvVar5 != (void *)0x0) {
LAB_00149585:
      push_translation_error("linking id both internally and externally",translation_data);
      return;
    }
  }
  return;
}

Assistant:

void resolve_object_linkage(struct Scope *scope,struct Translation_Data *translation_data,struct Denoted_Object *denoted_object)
{
	if(scope->type==FILE_SCOPE)
	{
		if(denoted_object->object->storage_class==SCS_NONE || denoted_object->object->storage_class==SCS_EXTERN)
		{
			denoted_object->linkage=LINKAGE_EXTERNAL;
			denoted_object->object->storage_class=SCS_STATIC;
			account_for_upper_linkage_on_object(scope,translation_data,denoted_object);

		}else if(denoted_object->object->storage_class==SCS_STATIC) 
		{
			denoted_object->linkage=LINKAGE_INTERNAL;
			denoted_object->object->storage_class=SCS_STATIC;
		}else
		{
			assert(0);
		}
	}else if(scope->type==FUNCTION_PROTOTYPE_SCOPE)
	{
		denoted_object->linkage=LINKAGE_NONE;
		denoted_object->object->storage_class=SCS_NONE;
		if(denoted_object->object->storage_class!=SCS_NONE && denoted_object->object->storage_class!=SCS_REGISTER)
		{
			push_translation_error("storage class specifier other than register in function prototype scope",translation_data);
			return ;
		}
	}else if(scope->type==BLOCK_SCOPE)
	{
		denoted_object->linkage=LINKAGE_NONE;
		/*here comes the spooky part*/
		if(denoted_object->object->storage_class==SCS_EXTERN)
			account_for_upper_linkage_on_object(scope,translation_data,denoted_object);
	}else
	{
		assert(0);
	}

	/*check if id is linked oppositely*/
	if(denoted_object->linkage==LINKAGE_EXTERNAL &&
		Map_Check(&translation_data->internal_linkage->ids,denoted_object->id->data,denoted_object->id->data_size)!=NULL)
	{
		push_translation_error("linking id both internally and externally",translation_data);
	}else if(denoted_object->linkage==LINKAGE_INTERNAL && 
		Map_Check(&translation_data->external_linkage->ids,denoted_object->id->data,denoted_object->id->data_size)!=NULL)
	{
		push_translation_error("linking id both internally and externally",translation_data);
	}
}